

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formdata.c
# Opt level: O3

int curl_formget(curl_httppost *form,void *arg,curl_formget_callback append)

{
  CURLcode CVar1;
  size_t sVar2;
  size_t sVar3;
  curl_mimepart toppart;
  char buffer [8192];
  curl_mimepart local_21f0;
  char local_2038 [8200];
  
  Curl_mime_initpart(&local_21f0);
  CVar1 = Curl_getformdata((Curl_easy *)0x0,&local_21f0,form,(curl_read_callback)0x0);
  if ((CVar1 == CURLE_OK) &&
     (CVar1 = Curl_mime_prepare_headers
                        ((Curl_easy *)0x0,&local_21f0,"multipart/form-data",(char *)0x0,
                         MIMESTRATEGY_FORM), CVar1 == CURLE_OK)) {
    sVar2 = Curl_mime_read(local_2038,1,0x2000,&local_21f0);
    if (sVar2 != 0) {
      do {
        if ((0x2000 < sVar2) || (sVar3 = (*append)(arg,local_2038,sVar2), sVar3 != sVar2)) {
          CVar1 = (uint)(sVar2 == 0x10000000) * 0x10 + CURLE_READ_ERROR;
          goto LAB_001270f2;
        }
        sVar2 = Curl_mime_read(local_2038,1,0x2000,&local_21f0);
      } while (sVar2 != 0);
    }
    CVar1 = CURLE_OK;
  }
LAB_001270f2:
  Curl_mime_cleanpart(&local_21f0);
  return CVar1;
}

Assistant:

int curl_formget(struct curl_httppost *form, void *arg,
                 curl_formget_callback append)
{
  CURLcode result;
  curl_mimepart toppart;

  Curl_mime_initpart(&toppart); /* default form is empty */
  result = Curl_getformdata(NULL, &toppart, form, NULL);
  if(!result)
    result = Curl_mime_prepare_headers(NULL, &toppart, "multipart/form-data",
                                       NULL, MIMESTRATEGY_FORM);

  while(!result) {
    char buffer[8192];
    size_t nread = Curl_mime_read(buffer, 1, sizeof(buffer), &toppart);

    if(!nread)
      break;

    if(nread > sizeof(buffer) || append(arg, buffer, nread) != nread) {
      result = CURLE_READ_ERROR;
      if(nread == CURL_READFUNC_ABORT)
        result = CURLE_ABORTED_BY_CALLBACK;
    }
  }

  Curl_mime_cleanpart(&toppart);
  return (int) result;
}